

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

bool __thiscall
Clasp::Asp::LogicProgram::extractCore(LogicProgram *this,LitVec *solverCore,LitVec *prgLits)

{
  bool bVar1;
  size_type sVar2;
  Literal LVar3;
  size_type sVar4;
  const_iterator pLVar5;
  const_iterator puVar6;
  LogicProgram *this_00;
  LogicProgram *pLVar7;
  pod_vector<int,_std::allocator<int>_> *in_RDX;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  ProgramBuilder *in_RDI;
  const_iterator it_3;
  Literal lit_1;
  const_iterator end_1;
  const_iterator it_2;
  Literal lit;
  PrgAtom *atom;
  const_iterator end;
  const_iterator it_1;
  const_iterator it;
  uint32 marked;
  undefined4 in_stack_ffffffffffffff18;
  Var in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  SharedContext *in_stack_ffffffffffffff28;
  pod_vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  byte local_a6;
  Literal *local_88;
  MapLit_t local_78;
  uint32 local_74;
  MapLit_t in_stack_ffffffffffffffa0;
  Id_t *local_38;
  Literal *local_28;
  size_type local_1c;
  
  local_1c = 0;
  bk_lib::pod_vector<int,_std::allocator<int>_>::clear(in_RDX);
  for (local_28 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin(in_RSI)
      ; pLVar5 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(in_RSI),
      local_28 != pLVar5; local_28 = local_28 + 1) {
    ProgramBuilder::ctx(in_RDI);
    Literal::var(local_28);
    bVar1 = SharedContext::validVar
                      ((SharedContext *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
    if (!bVar1) break;
    ProgramBuilder::ctx(in_RDI);
    SharedContext::mark(in_stack_ffffffffffffff28,
                        (Literal)(uint32)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    local_1c = local_1c + 1;
  }
  sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(in_RSI);
  if (local_1c == sVar2) {
    local_38 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &in_RDI[9].parser_);
    puVar6 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &in_RDI[9].parser_);
    for (; local_38 != puVar6 && local_1c != 0; local_38 = local_38 + 1) {
      getRootAtom((LogicProgram *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                  in_stack_ffffffffffffff1c);
      LVar3 = PrgHead::assumption((PrgHead *)in_stack_ffffffffffffff28);
      lit_true();
      bVar1 = Clasp::operator==((Literal *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                (Literal *)
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_a6 = 1;
      if (!bVar1) {
        ProgramBuilder::ctx(in_RDI);
        bVar1 = SharedContext::marked
                          (in_stack_ffffffffffffff28,
                           (Literal)(uint32)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        local_a6 = bVar1 ^ 0xff;
      }
      if ((local_a6 & 1) == 0) {
        PrgNode::literal((PrgNode *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        bVar1 = Clasp::operator==((Literal *)
                                  CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                  (Literal *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        if (bVar1) {
          Potassco::lit(*local_38);
        }
        else {
          Potassco::neg(0);
        }
        bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                  (in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28);
        ProgramBuilder::ctx(in_RDI);
        SharedContext::unmark
                  (in_stack_ffffffffffffff28,
                   (Literal)(uint32)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        local_1c = local_1c - 1;
        in_stack_ffffffffffffffa0.val_ = LVar3.rep_;
      }
    }
    this_00 = (LogicProgram *)
              bk_lib::pod_vector<int,_std::allocator<int>_>::begin
                        ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 10));
    pLVar7 = (LogicProgram *)
             bk_lib::pod_vector<int,_std::allocator<int>_>::end
                       ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 10));
    for (; this_00 != pLVar7 && local_1c != 0;
        this_00 = (LogicProgram *)((long)&(this_00->super_ProgramBuilder)._vptr_ProgramBuilder + 4))
    {
      Potassco::id(*(Lit_t *)&(this_00->super_ProgramBuilder)._vptr_ProgramBuilder);
      MapLit_t::MapLit_t(&local_78,Raw);
      local_74 = (uint32)getLiteral(this_00,(Id_t)((ulong)pLVar7 >> 0x20),in_stack_ffffffffffffffa0)
      ;
      ProgramBuilder::ctx(in_RDI);
      bVar1 = SharedContext::marked
                        (in_stack_ffffffffffffff28,
                         (Literal)(uint32)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      if (bVar1) {
        bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                  (in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28);
        ProgramBuilder::ctx(in_RDI);
        SharedContext::unmark
                  (in_stack_ffffffffffffff28,
                   (Literal)(uint32)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        local_1c = local_1c - 1;
      }
    }
  }
  for (local_88 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin(in_RSI)
      ; pLVar5 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end(in_RSI),
      local_88 != pLVar5; local_88 = local_88 + 1) {
    ProgramBuilder::ctx(in_RDI);
    Literal::var(local_88);
    bVar1 = SharedContext::validVar
                      ((SharedContext *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
    if (bVar1) {
      ProgramBuilder::ctx(in_RDI);
      Literal::var(local_88);
      SharedContext::unmark
                ((SharedContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
    }
  }
  sVar4 = bk_lib::pod_vector<int,_std::allocator<int>_>::size(in_RDX);
  sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(in_RSI);
  return sVar4 == sVar2;
}

Assistant:

bool LogicProgram::extractCore(const LitVec& solverCore, Potassco::LitVec& prgLits) const 	{
	uint32 marked = 0;
	prgLits.clear();
	for (LitVec::const_iterator it = solverCore.begin(); it != solverCore.end(); ++it) {
		if (!ctx()->validVar(it->var())) { break; }
		ctx()->mark(*it);
		++marked;
	}
	if (marked == solverCore.size()) {
		for (VarVec::const_iterator it = frozen_.begin(), end = frozen_.end(); it != end && marked; ++it) {
			PrgAtom* atom = getRootAtom(*it);
			Literal lit = atom->assumption();
			if (lit == lit_true() || !ctx()->marked(lit)) continue;
			prgLits.push_back(atom->literal() == lit ? Potassco::lit(*it) : Potassco::neg(*it));
			ctx()->unmark(lit);
			--marked;
		}
		for (Potassco::LitVec::const_iterator it = assume_.begin(), end = assume_.end(); it != end && marked; ++it) {
			Literal lit = getLiteral(Potassco::id(*it));
			if (!ctx()->marked(lit)) continue;
			prgLits.push_back(*it);
			ctx()->unmark(lit);
			--marked;
		}
	}
	for (LitVec::const_iterator it = solverCore.begin(); it != solverCore.end(); ++it) {
		if (ctx()->validVar(it->var()))
			ctx()->unmark(it->var());
	}
	return prgLits.size() == solverCore.size();
}